

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::StringTrieBuilder::writeBranchSubNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,int32_t length)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  UBool isFinal [4];
  int32_t starts [5];
  int32_t jumpTargets [4];
  UChar middleUnits [14];
  int32_t lessThan [14];
  undefined4 local_e0;
  char local_dc [4];
  ulong local_d8;
  long local_d0;
  int32_t local_c4;
  ulong local_c0;
  uint local_b8 [6];
  ulong local_a0;
  int32_t aiStack_98 [3];
  ushort auStack_8c [14];
  uint auStack_70 [16];
  
  uVar8 = (ulong)(uint)unitIndex;
  local_c4 = limit;
  iVar2 = (*(this->super_UObject)._vptr_UObject[0xb])();
  local_d8 = uVar8;
  if (iVar2 < length) {
    uVar9 = 0;
    do {
      local_d0 = CONCAT44(local_d0._4_4_,start);
      uVar6 = length / 2;
      start = (*(this->super_UObject)._vptr_UObject[8])(this,(ulong)(uint)start,uVar8,(ulong)uVar6);
      iVar2 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)(uint)start,uVar8);
      auStack_8c[uVar9 + 2] = (ushort)iVar2;
      uVar3 = writeBranchSubNode(this,(int32_t)local_d0,start,unitIndex,uVar6);
      auStack_70[uVar9 + 2] = uVar3;
      uVar9 = uVar9 + 1;
      length = length - uVar6;
      iVar2 = (*(this->super_UObject)._vptr_UObject[0xb])(this);
    } while (iVar2 < length);
    unitIndex = (int32_t)local_d8;
    local_c0 = uVar9;
  }
  else {
    local_c0 = 0;
  }
  uVar8 = local_d8;
  local_a0 = 1;
  if (1 < (int)(length - 1U)) {
    local_a0 = (ulong)(length - 1U);
  }
  local_e0 = unitIndex + 1;
  local_d0 = -local_a0;
  lVar7 = 1;
  do {
    local_b8[lVar7 + -1] = start;
    uVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)(uint)start,uVar8 & 0xffffffff);
    uVar3 = (*(this->super_UObject)._vptr_UObject[9])
                      (this,(ulong)(start + 1),uVar8 & 0xffffffff,(ulong)(uVar3 & 0xffff));
    if (start == uVar3 - 1) {
      iVar2 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(uint)start);
      bVar10 = local_e0 == iVar2;
    }
    else {
      bVar10 = false;
    }
    local_dc[lVar7 + -1] = bVar10;
    uVar9 = local_d8;
    lVar5 = local_d0 + lVar7;
    lVar7 = lVar7 + 1;
    start = uVar3;
  } while (lVar5 != 0);
  local_b8[local_a0] = uVar3;
  do {
    if (local_dc[lVar7 + -2] == '\0') {
      iVar4 = writeNode(this,local_b8[lVar7 + -2],local_b8[lVar7 + -1],local_e0);
      aiStack_98[lVar7 + -2] = iVar4;
    }
    lVar7 = lVar7 + -1;
  } while (1 < lVar7);
  writeNode(this,uVar3,local_c4,local_e0);
  uVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar3,uVar9 & 0xffffffff);
  iVar2 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uVar3 & 0xffff));
  if (1 < length) {
    lVar7 = (ulong)(length - 2) + 1;
    do {
      uVar3 = local_b8[lVar7 + -1];
      cVar1 = local_dc[lVar7 + -1];
      if (cVar1 == '\0') {
        uVar6 = iVar2 - aiStack_98[lVar7 + -1];
      }
      else {
        uVar6 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)uVar3);
      }
      (*(this->super_UObject)._vptr_UObject[0x11])(this,(ulong)uVar6,(ulong)(uint)(int)cVar1);
      uVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar3,uVar9 & 0xffffffff);
      iVar2 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uVar3 & 0xffff));
      lVar5 = lVar7 + -1;
      bVar10 = 0 < lVar7;
      lVar7 = lVar5;
    } while (lVar5 != 0 && bVar10);
  }
  if (0 < (int)local_c0) {
    uVar8 = (local_c0 & 0xffffffff) + 1;
    do {
      (*(this->super_UObject)._vptr_UObject[0x13])(this,(ulong)auStack_70[uVar8]);
      iVar2 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)auStack_8c[uVar8]);
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  return iVar2;
}

Assistant:

int32_t
StringTrieBuilder::writeBranchSubNode(int32_t start, int32_t limit, int32_t unitIndex, int32_t length) {
    UChar middleUnits[kMaxSplitBranchLevels];
    int32_t lessThan[kMaxSplitBranchLevels];
    int32_t ltLength=0;
    while(length>getMaxBranchLinearSubNodeLength()) {
        // Branch on the middle unit.
        // First, find the middle unit.
        int32_t i=skipElementsBySomeUnits(start, unitIndex, length/2);
        // Encode the less-than branch first.
        middleUnits[ltLength]=getElementUnit(i, unitIndex);  // middle unit
        lessThan[ltLength]=writeBranchSubNode(start, i, unitIndex, length/2);
        ++ltLength;
        // Continue for the greater-or-equal branch.
        start=i;
        length=length-length/2;
    }
    // For each unit, find its elements array start and whether it has a final value.
    int32_t starts[kMaxBranchLinearSubNodeLength];
    UBool isFinal[kMaxBranchLinearSubNodeLength-1];
    int32_t unitNumber=0;
    do {
        int32_t i=starts[unitNumber]=start;
        UChar unit=getElementUnit(i++, unitIndex);
        i=indexOfElementWithNextUnit(i, unitIndex, unit);
        isFinal[unitNumber]= start==i-1 && unitIndex+1==getElementStringLength(start);
        start=i;
    } while(++unitNumber<length-1);
    // unitNumber==length-1, and the maxUnit elements range is [start..limit[
    starts[unitNumber]=start;

    // Write the sub-nodes in reverse order: The jump lengths are deltas from
    // after their own positions, so if we wrote the minUnit sub-node first,
    // then its jump delta would be larger.
    // Instead we write the minUnit sub-node last, for a shorter delta.
    int32_t jumpTargets[kMaxBranchLinearSubNodeLength-1];
    do {
        --unitNumber;
        if(!isFinal[unitNumber]) {
            jumpTargets[unitNumber]=writeNode(starts[unitNumber], starts[unitNumber+1], unitIndex+1);
        }
    } while(unitNumber>0);
    // The maxUnit sub-node is written as the very last one because we do
    // not jump for it at all.
    unitNumber=length-1;
    writeNode(start, limit, unitIndex+1);
    int32_t offset=write(getElementUnit(start, unitIndex));
    // Write the rest of this node's unit-value pairs.
    while(--unitNumber>=0) {
        start=starts[unitNumber];
        int32_t value;
        if(isFinal[unitNumber]) {
            // Write the final value for the one string ending with this unit.
            value=getElementValue(start);
        } else {
            // Write the delta to the start position of the sub-node.
            value=offset-jumpTargets[unitNumber];
        }
        writeValueAndFinal(value, isFinal[unitNumber]);
        offset=write(getElementUnit(start, unitIndex));
    }
    // Write the split-branch nodes.
    while(ltLength>0) {
        --ltLength;
        writeDeltaTo(lessThan[ltLength]);
        offset=write(middleUnits[ltLength]);
    }
    return offset;
}